

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_base.cpp
# Opt level: O2

void __thiscall
zmq::socket_base_t::inprocs_t::emplace(inprocs_t *this,char *endpoint_uri_,pipe_t *pipe_)

{
  allocator<char> local_41;
  pipe_t *local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  local_40 = pipe_;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,endpoint_uri_,&local_41);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,zmq::pipe_t*>,std::_Select1st<std::pair<std::__cxx11::string_const,zmq::pipe_t*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,zmq::pipe_t*>>>
  ::_M_emplace_equal<std::__cxx11::string,zmq::pipe_t*&>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,zmq::pipe_t*>,std::_Select1st<std::pair<std::__cxx11::string_const,zmq::pipe_t*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,zmq::pipe_t*>>>
              *)this,&local_38,&local_40);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void zmq::socket_base_t::inprocs_t::emplace (const char *endpoint_uri_,
                                             pipe_t *pipe_)
{
    _inprocs.ZMQ_MAP_INSERT_OR_EMPLACE (std::string (endpoint_uri_), pipe_);
}